

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall
Catch::ReporterRegistrar<Catch::JunitReporter>::ReporterFactory::getDescription_abi_cxx11_
          (ReporterFactory *this)

{
  string *in_RDI;
  
  JunitReporter::getDescription_abi_cxx11_();
  return in_RDI;
}

Assistant:

std::string getDescription() const override {
                return T::getDescription();
            }